

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

mz_bool mz_zip_writer_finalize_heap_archive(mz_zip_archive *pZip,void **pBuf,size_t *pSize)

{
  mz_bool mVar1;
  size_t *pSize_local;
  void **pBuf_local;
  mz_zip_archive *pZip_local;
  
  if ((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
      (pBuf == (void **)0x0)) || (pSize == (size_t *)0x0)) {
    pZip_local._4_4_ = 0;
  }
  else if (pZip->m_pWrite == mz_zip_heap_write_func) {
    mVar1 = mz_zip_writer_finalize_archive(pZip);
    if (mVar1 == 0) {
      pZip_local._4_4_ = 0;
    }
    else {
      *pBuf = pZip->m_pState->m_pMem;
      *pSize = pZip->m_pState->m_mem_size;
      pZip->m_pState->m_pMem = (void *)0x0;
      pZip->m_pState->m_mem_capacity = 0;
      pZip->m_pState->m_mem_size = 0;
      pZip_local._4_4_ = 1;
    }
  }
  else {
    pZip_local._4_4_ = 0;
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_writer_finalize_heap_archive(mz_zip_archive *pZip, void **pBuf, size_t *pSize)
{
  if ((!pZip) || (!pZip->m_pState) || (!pBuf) || (!pSize))
    return MZ_FALSE;
  if (pZip->m_pWrite != mz_zip_heap_write_func)
    return MZ_FALSE;
  if (!mz_zip_writer_finalize_archive(pZip))
    return MZ_FALSE;

  *pBuf = pZip->m_pState->m_pMem;
  *pSize = pZip->m_pState->m_mem_size;
  pZip->m_pState->m_pMem = NULL;
  pZip->m_pState->m_mem_size = pZip->m_pState->m_mem_capacity = 0;
  return MZ_TRUE;
}